

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

int uv_timer_stop(uv_timer_t *handle)

{
  heap *heap;
  uv_timer_t *handle_local;
  
  if ((handle->flags & 4) != 0) {
    heap = timer_heap(handle->loop);
    heap_remove(heap,(heap_node *)handle->heap_node,timer_less_than);
    if (((handle->flags & 4) != 0) &&
       (handle->flags = handle->flags & 0xfffffffb, (handle->flags & 8) != 0)) {
      handle->loop->active_handles = handle->loop->active_handles - 1;
    }
  }
  return 0;
}

Assistant:

int uv_timer_stop(uv_timer_t* handle) {
  if (!uv__is_active(handle))
    return 0;

  heap_remove(timer_heap(handle->loop),
              (struct heap_node*) &handle->heap_node,
              timer_less_than);
  uv__handle_stop(handle);

  return 0;
}